

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O2

bool __thiscall
absl::log_internal::EncodeBytes
          (log_internal *this,uint64_t tag,Span<const_char> value,Span<char> *buf)

{
  uint64_t value_00;
  pointer n;
  size_t size;
  size_t size_00;
  Span<char> *this_00;
  pointer value_01;
  
  this_00 = (Span<char> *)value.len_;
  value_01 = value.ptr_;
  value_00 = (long)this * 8 + 2;
  size = VarintSize(value_00);
  size_00 = VarintSize((uint64_t)value_01);
  n = (pointer)this_00->len_;
  if (n < value_01 + size + size_00) {
    Span<char>::remove_suffix(this_00,(size_type)n);
  }
  else {
    anon_unknown_1::EncodeRawVarint(value_00,size,this_00);
    anon_unknown_1::EncodeRawVarint((uint64_t)value_01,size_00,this_00);
    memcpy(this_00->ptr_,(void *)tag,(size_t)value_01);
    Span<char>::remove_prefix(this_00,(size_type)value_01);
  }
  return value_01 + size + size_00 <= n;
}

Assistant:

bool EncodeBytes(uint64_t tag, absl::Span<const char> value,
                 absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  uint64_t length = value.size();
  const size_t length_size = VarintSize(length);
  if (tag_type_size + length_size + value.size() > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(length, length_size, buf);
  memcpy(buf->data(), value.data(), value.size());
  buf->remove_prefix(value.size());
  return true;
}